

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

uint32_t __thiscall kratos::PackedStruct::bitwidth(PackedStruct *this)

{
  pointer pPVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  PackedStructFieldDef *def;
  pointer pPVar4;
  
  pPVar1 = (this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (pPVar4 = (this->attributes).
                super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
    if (pPVar4->struct_ == (PackedStruct *)0x0) {
      uVar2 = pPVar4->width;
    }
    else {
      uVar2 = bitwidth(pPVar4->struct_);
    }
    uVar3 = uVar3 + uVar2;
  }
  return uVar3;
}

Assistant:

uint32_t PackedStruct::bitwidth() const {
    uint32_t result = 0;
    for (auto const &def : attributes) {
        result += def.bitwidth();
    }
    return result;
}